

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawListFlags *pIVar2;
  ImDrawList *pIVar3;
  float *pfVar4;
  ImGuiNavMoveResult *pIVar5;
  bool *pbVar6;
  ImGuiNextWindowData *pIVar7;
  ImVec2 *pIVar8;
  float fVar9;
  ImGuiID IVar10;
  ImGuiInputSource IVar11;
  ImGuiID IVar12;
  ImFontAtlas *pIVar13;
  uint *puVar14;
  ImGuiWindow **ppIVar15;
  ImGuiPopupData *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  bool bVar21;
  int i;
  int iVar22;
  int iVar23;
  long lVar24;
  uint *__dest;
  ImGuiWindow *pIVar25;
  ulong uVar26;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i_1;
  uint uVar27;
  ImGuiWindow *window_00;
  char *pcVar28;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar29;
  ImGuiContext *g_4;
  byte bVar30;
  ImGuiWindow *old_nav_window;
  ImGuiNavMoveResult *pIVar31;
  ImRect *pIVar32;
  float *pfVar33;
  ImGuiNavLayer IVar34;
  ImFont *font;
  float *pfVar35;
  ImGuiWindow *window;
  ImGuiContext *g_1;
  ImGuiContext *g;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  byte bVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  double dVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  float fVar52;
  ImVec2 IVar53;
  float fVar54;
  float fVar55;
  ImVec2 IVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  ImRect local_40;
  
  pIVar17 = GImGui;
  bVar40 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xe75,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if ((pIVar13->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar13->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a50,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a51,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a52,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar42 = (GImGui->Style).Alpha;
  if ((fVar42 < 0.0) || (1.0 < fVar42)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a53,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a54,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a55,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar24 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar24] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x1a57,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a5b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar17->SettingsLoaded == false) {
    if ((pIVar17->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2548,"void ImGui::UpdateSettings()");
    }
    pcVar28 = (pIVar17->IO).IniFilename;
    if (pcVar28 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar28);
    }
    pIVar17->SettingsLoaded = true;
  }
  if ((0.0 < pIVar17->SettingsDirtyTimer) &&
     (fVar42 = pIVar17->SettingsDirtyTimer - (pIVar17->IO).DeltaTime,
     pIVar17->SettingsDirtyTimer = fVar42, fVar42 <= 0.0)) {
    pcVar28 = (pIVar17->IO).IniFilename;
    if (pcVar28 == (char *)0x0) {
      (pIVar17->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar28);
    }
    pIVar17->SettingsDirtyTimer = 0.0;
  }
  pIVar17->Time = (double)(pIVar17->IO).DeltaTime + pIVar17->Time;
  pIVar17->WithinFrameScope = true;
  pIVar17->FrameCount = pIVar17->FrameCount + 1;
  pIVar17->TooltipOverrideCount = 0;
  pIVar17->WindowsActiveCount = 0;
  iVar23 = (pIVar17->MenusIdSubmittedThisFrame).Capacity;
  if (iVar23 < 0) {
    uVar27 = iVar23 / 2 + iVar23;
    uVar41 = 0;
    if (0 < (int)uVar27) {
      uVar41 = uVar27;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar41 * 4,GImAllocatorUserData);
    puVar14 = (pIVar17->MenusIdSubmittedThisFrame).Data;
    if (puVar14 != (uint *)0x0) {
      memcpy(__dest,puVar14,(long)(pIVar17->MenusIdSubmittedThisFrame).Size << 2);
      puVar14 = (pIVar17->MenusIdSubmittedThisFrame).Data;
      if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
    }
    (pIVar17->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar17->MenusIdSubmittedThisFrame).Capacity = uVar41;
  }
  (pIVar17->MenusIdSubmittedThisFrame).Size = 0;
  fVar42 = (pIVar17->IO).DeltaTime;
  iVar23 = pIVar17->FramerateSecPerFrameIdx;
  pIVar17->FramerateSecPerFrameAccum =
       (fVar42 - pIVar17->FramerateSecPerFrame[iVar23]) + pIVar17->FramerateSecPerFrameAccum;
  pIVar17->FramerateSecPerFrame[iVar23] = fVar42;
  iVar22 = iVar23 + (int)((ulong)((long)(iVar23 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar17->FramerateSecPerFrameIdx = iVar23 + 1 + ((iVar22 >> 6) - (iVar22 >> 0x1f)) * -0x78;
  uVar41 = -(uint)(0.0 < pIVar17->FramerateSecPerFrameAccum);
  (pIVar17->IO).Framerate =
       (float)(~uVar41 & 0x7f7fffff |
              (uint)(1.0 / (pIVar17->FramerateSecPerFrameAccum / 120.0)) & uVar41);
  ((pIVar17->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar13 = (GImGui->IO).Fonts;
    if ((pIVar13->Fonts).Size < 1) {
      pcVar28 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0015614a:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                    ,0x52a,pcVar28);
    }
    font = *(pIVar13->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar17->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xe92,"void ImGui::NewFrame()");
  }
  fVar42 = (pIVar17->IO).DisplaySize.x;
  fVar43 = (pIVar17->IO).DisplaySize.y;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.z = fVar42;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.w = fVar43;
  (pIVar17->DrawListSharedData).CurveTessellationTol = (pIVar17->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError
            (&pIVar17->DrawListSharedData,(pIVar17->Style).CircleSegmentMaxError);
  uVar41 = (uint)(pIVar17->Style).AntiAliasedLines;
  (pIVar17->DrawListSharedData).InitialFlags = uVar41;
  if ((pIVar17->Style).AntiAliasedFill == true) {
    (pIVar17->DrawListSharedData).InitialFlags = uVar41 | 2;
  }
  if (((pIVar17->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar17->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  pIVar3 = &pIVar17->BackgroundDrawList;
  ImDrawList::Clear(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar17->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  pIVar3 = &pIVar17->ForegroundDrawList;
  ImDrawList::Clear(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar17->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  (pIVar17->DrawData).Valid = false;
  (pIVar17->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar17->DrawData).CmdListsCount = 0;
  (pIVar17->DrawData).TotalIdxCount = 0;
  (pIVar17->DrawData).TotalVtxCount = 0;
  (pIVar17->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar17->DrawData).DisplayPos.y = 0;
  (pIVar17->DrawData).DisplaySize.x = 0.0;
  (pIVar17->DrawData).DisplaySize.y = 0.0;
  (pIVar17->DrawData).FramebufferScale.x = 0.0;
  pIVar18 = GImGui;
  (pIVar17->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar17->DragDropActive == true) &&
     (IVar10 = (pIVar17->DragDropPayload).SourceId, IVar10 == pIVar17->ActiveId)) {
    if (GImGui->ActiveId == IVar10) {
      GImGui->ActiveIdIsAlive = IVar10;
    }
    if (pIVar18->ActiveIdPreviousFrame == IVar10) {
      pIVar18->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar17->HoveredIdPreviousFrame == 0) {
    pIVar17->HoveredIdTimer = 0.0;
LAB_001537f1:
    pIVar17->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar17->HoveredId != 0) && (pIVar17->ActiveId == pIVar17->HoveredId))
  goto LAB_001537f1;
  IVar10 = pIVar17->HoveredId;
  if ((IVar10 != 0) &&
     (pIVar17->HoveredIdTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdTimer,
     pIVar17->ActiveId != IVar10)) {
    pIVar17->HoveredIdNotActiveTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdNotActiveTimer;
  }
  pIVar17->HoveredIdPreviousFrame = IVar10;
  pIVar17->HoveredId = 0;
  pIVar17->HoveredIdAllowOverlap = false;
  IVar10 = pIVar17->ActiveId;
  if (((pIVar17->ActiveIdIsAlive != IVar10) && (IVar10 != 0)) &&
     (pIVar17->ActiveIdPreviousFrame == IVar10)) {
    ClearActiveID();
  }
  IVar10 = pIVar17->ActiveId;
  if (IVar10 != 0) {
    pIVar17->ActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->ActiveIdTimer;
  }
  pIVar17->LastActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->LastActiveIdTimer;
  pIVar17->ActiveIdPreviousFrame = IVar10;
  pIVar17->ActiveIdPreviousFrameWindow = pIVar17->ActiveIdWindow;
  pIVar17->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar17->ActiveIdHasBeenEditedBefore;
  pIVar17->ActiveIdIsAlive = 0;
  pIVar17->ActiveIdHasBeenEditedThisFrame = false;
  pIVar17->ActiveIdPreviousFrameIsAlive = false;
  pIVar17->ActiveIdIsJustActivated = false;
  if (IVar10 != pIVar17->TempInputId && pIVar17->TempInputId != 0) {
    pIVar17->TempInputId = 0;
  }
  if (IVar10 == 0) {
    pIVar17->ActiveIdUsingNavDirMask = 0;
    pIVar17->ActiveIdUsingNavInputMask = 0;
    pIVar17->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar17->DragDropAcceptIdPrev = pIVar17->DragDropAcceptIdCurr;
  pIVar17->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar17->DragDropAcceptIdCurr = 0;
  pIVar17->DragDropWithinSource = false;
  pIVar18 = GImGui;
  pIVar17->DragDropWithinTarget = false;
  bVar37 = (GImGui->IO).KeyCtrl;
  uVar41 = bVar37 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar41 = (uint)bVar37;
  }
  uVar27 = uVar41 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar27 = uVar41;
  }
  uVar41 = uVar27 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar41 = uVar27;
  }
  (pIVar17->IO).KeyMods = uVar41;
  pfVar4 = (pIVar17->IO).KeysDownDuration;
  memcpy((pIVar17->IO).KeysDownDurationPrev,pfVar4,0x800);
  lVar24 = 0;
  do {
    fVar42 = -1.0;
    if ((pIVar17->IO).KeysDown[lVar24] == true) {
      fVar42 = 0.0;
      if (0.0 <= pfVar4[lVar24]) {
        fVar42 = pfVar4[lVar24] + (pIVar17->IO).DeltaTime;
      }
    }
    pfVar4[lVar24] = fVar42;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x200);
  (pIVar18->IO).WantSetMousePos = false;
  uVar41 = (pIVar18->IO).ConfigFlags;
  if ((uVar41 & 2) == 0) {
    bVar30 = 0;
  }
  else {
    bVar30 = (byte)(pIVar18->IO).BackendFlags & 1;
  }
  if ((bVar30 != 0) &&
     (((0.0 < (pIVar18->IO).NavInputs[0] || (0.0 < (pIVar18->IO).NavInputs[2])) ||
      ((0.0 < (pIVar18->IO).NavInputs[1] || (0.0 < (pIVar18->IO).NavInputs[3])))))) {
    pIVar18->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar41 & 1) != 0) {
    iVar23 = (pIVar18->IO).KeyMap[0xc];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[0xd];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[2] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[0xe];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[1] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[1];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x11] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[2];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x12] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[3];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_00156154;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x13] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[4];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) {
LAB_00156154:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x111c,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x14] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar37 = (pIVar18->IO).KeyCtrl;
    if (bVar37 == true) {
      (pIVar18->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar18->IO).KeyShift == true) {
      (pIVar18->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar37 == false) && ((pIVar18->IO).KeyAlt != false)) {
      (pIVar18->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar4 = (pIVar18->IO).NavInputsDownDuration;
  pfVar33 = pfVar4;
  pfVar35 = (pIVar18->IO).NavInputsDownDurationPrev;
  for (lVar24 = 0x15; lVar24 != 0; lVar24 = lVar24 + -1) {
    *pfVar35 = *pfVar33;
    pfVar33 = pfVar33 + (ulong)bVar40 * -2 + 1;
    pfVar35 = pfVar35 + (ulong)bVar40 * -2 + 1;
  }
  lVar24 = 0;
  do {
    fVar42 = -1.0;
    if (0.0 < (pIVar18->IO).NavInputs[lVar24]) {
      fVar42 = 0.0;
      if (0.0 <= pfVar4[lVar24]) {
        fVar42 = pfVar4[lVar24] + (pIVar18->IO).DeltaTime;
      }
    }
    pfVar4[lVar24] = fVar42;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x15);
  IVar10 = pIVar18->NavInitResultId;
  if ((IVar10 != 0) &&
     (((pIVar18->NavDisableHighlight != true || (pIVar18->NavInitRequestFromMove == true)) &&
      (pIVar18->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar34 = pIVar18->NavLayer;
    if (pIVar18->NavInitRequestFromMove == true) {
      SetNavID(IVar10,IVar34,0);
      IVar45 = (pIVar18->NavInitResultRectRel).Max;
      pIVar8 = &pIVar18->NavWindow->NavRectRel[(int)IVar34].Min;
      *pIVar8 = (pIVar18->NavInitResultRectRel).Min;
      pIVar8[1] = IVar45;
      pIVar18->NavMousePosDirty = true;
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar10,IVar34,0);
    }
    IVar45 = (pIVar18->NavInitResultRectRel).Max;
    pIVar8 = &pIVar18->NavWindow->NavRectRel[pIVar18->NavLayer].Min;
    *pIVar8 = (pIVar18->NavInitResultRectRel).Min;
    pIVar8[1] = IVar45;
  }
  pIVar18->NavInitRequest = false;
  pIVar18->NavInitRequestFromMove = false;
  pIVar18->NavInitResultId = 0;
  pIVar18->NavJustMovedToId = 0;
  pIVar19 = GImGui;
  if (pIVar18->NavMoveRequest == true) {
    IVar10 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar10 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar5 = &GImGui->NavMoveResultOther;
      pIVar31 = &GImGui->NavMoveResultLocal;
      if (IVar10 == 0) {
        pIVar31 = pIVar5;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar10 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar10 != 0)) &&
         (IVar10 != GImGui->NavId)) {
        pIVar31 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar31 != pIVar5) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar42 = (GImGui->NavMoveResultOther).DistBox;
        fVar43 = pIVar31->DistBox;
        if (fVar43 <= fVar42) {
          if (((fVar42 != fVar43) || (NAN(fVar42) || NAN(fVar43))) ||
             (pfVar4 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar31->DistCenter < *pfVar4 || pIVar31->DistCenter == *pfVar4)) goto LAB_00153dea;
        }
        pIVar31 = pIVar5;
      }
LAB_00153dea:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar25 = pIVar31->Window, pIVar25 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x21f8,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          fVar42 = (pIVar31->Window->Pos).x;
          fVar43 = (pIVar31->Window->Pos).y;
          local_40.Min.x = (pIVar31->RectRel).Min.x + fVar42;
          local_40.Max.x = fVar42 + (pIVar31->RectRel).Max.x;
          local_40.Min.y = (pIVar31->RectRel).Min.y + fVar43;
          local_40.Max.y = fVar43 + (pIVar31->RectRel).Max.y;
          IVar45 = ScrollToBringRectIntoView(pIVar31->Window,&local_40);
        }
        else {
          fVar42 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar42 = (pIVar25->ScrollMax).y;
          }
          IVar45 = (ImVec2)((ulong)(uint)((pIVar25->Scroll).y - fVar42) << 0x20);
          (pIVar25->ScrollTarget).y = fVar42;
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar42 = (pIVar31->RectRel).Min.y;
        (pIVar31->RectRel).Min.x = (pIVar31->RectRel).Min.x - IVar45.x;
        (pIVar31->RectRel).Max.x = (pIVar31->RectRel).Max.x - IVar45.x;
        (pIVar31->RectRel).Min.y = fVar42 - IVar45.y;
        (pIVar31->RectRel).Max.y = (pIVar31->RectRel).Max.y - IVar45.y;
      }
      ClearActiveID();
      pIVar19->NavWindow = pIVar31->Window;
      IVar10 = pIVar31->ID;
      if (pIVar19->NavId != IVar10) {
        pIVar19->NavJustMovedToId = IVar10;
        pIVar19->NavJustMovedToFocusScopeId = pIVar31->FocusScopeId;
        pIVar19->NavJustMovedToKeyMods = pIVar19->NavMoveRequestKeyMods;
      }
      pIVar20 = GImGui;
      IVar34 = pIVar19->NavLayer;
      SetNavID(IVar10,IVar34,pIVar31->FocusScopeId);
      IVar45 = (pIVar31->RectRel).Max;
      pIVar8 = &pIVar20->NavWindow->NavRectRel[(int)IVar34].Min;
      *pIVar8 = (pIVar31->RectRel).Min;
      pIVar8[1] = IVar45;
      pIVar20->NavMousePosDirty = true;
      pIVar20->NavDisableHighlight = false;
      pIVar20->NavDisableMouseHover = true;
      pIVar19->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar18->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2102,"void ImGui::NavUpdate()");
    }
    if (((pIVar18->NavMoveResultLocal).ID == 0) && ((pIVar18->NavMoveResultOther).ID == 0)) {
      pIVar18->NavDisableHighlight = false;
    }
    pIVar18->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar18->NavMousePosDirty == true) && (pIVar18->NavIdIsAlive == true)) {
    if ((((pIVar18->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar18->IO).BackendFlags & 4) != 0 && (pIVar18->NavDisableHighlight == false)) &&
         (pIVar18->NavDisableMouseHover == true)) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar45 = NavCalcPreferredRefPos();
      (pIVar18->IO).MousePosPrev = IVar45;
      (pIVar18->IO).MousePos = IVar45;
      (pIVar18->IO).WantSetMousePos = true;
    }
    pIVar18->NavMousePosDirty = false;
  }
  pIVar18->NavIdIsAlive = false;
  pIVar18->NavJustTabbedId = 0;
  IVar34 = pIVar18->NavLayer;
  if (ImGuiNavLayer_Menu < IVar34) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x2118,"void ImGui::NavUpdate()");
  }
  pIVar25 = pIVar18->NavWindow;
  pIVar29 = pIVar25;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar29->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar29 != pIVar25) {
          pIVar29->NavLastChildNavWindow = pIVar25;
        }
        break;
      }
      ppIVar15 = &pIVar29->ParentWindow;
      pIVar29 = *ppIVar15;
    } while (*ppIVar15 != (ImGuiWindow *)0x0);
    if (((pIVar25 != (ImGuiWindow *)0x0) && (IVar34 == ImGuiNavLayer_Main)) &&
       (pIVar25->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar25->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar19 = GImGui;
  pIVar25 = GetTopMostPopupModal();
  if (pIVar25 == (ImGuiWindow *)0x0) {
    if ((pIVar19->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar42 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->NavWindowingHighlightAlpha;
      fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
      pIVar19->NavWindowingHighlightAlpha = fVar42;
      if ((pIVar19->DimBgRatio <= 0.0) && (fVar42 <= 0.0)) {
        pIVar19->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar37 = (pIVar19->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar19->IO).KeyCtrl != true) || (iVar23 = (pIVar19->IO).KeyMap[0], iVar23 < 0)) ||
         (bVar39 = IsKeyPressed(iVar23,true), !bVar39)) goto LAB_00154149;
      bVar40 = (byte)(pIVar19->IO).ConfigFlags & 1;
    }
    else {
      bVar37 = false;
LAB_00154149:
      bVar40 = 0;
    }
    if (bVar37 || bVar40 != 0) {
      pIVar25 = pIVar19->NavWindow;
      if (pIVar25 == (ImGuiWindow *)0x0) {
        pIVar25 = FindWindowNavFocusable((pIVar19->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar25 != (ImGuiWindow *)0x0) {
        pIVar25 = pIVar25->RootWindow;
        pIVar19->NavWindowingTargetAnim = pIVar25;
        pIVar19->NavWindowingTarget = pIVar25;
        pIVar19->NavWindowingTimer = 0.0;
        pIVar19->NavWindowingHighlightAlpha = 0.0;
        pIVar19->NavWindowingToggleLayer = (bool)(bVar40 ^ 1);
        pIVar19->NavInputSource = ImGuiInputSource_NavGamepad - bVar40;
      }
    }
    fVar42 = (pIVar19->IO).DeltaTime + pIVar19->NavWindowingTimer;
    pIVar19->NavWindowingTimer = fVar42;
    if ((pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar19->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_001542a5:
      bVar37 = false;
      pIVar25 = (ImGuiWindow *)0x0;
    }
    else {
      fVar43 = (fVar42 + -0.2) / 0.05;
      fVar42 = 1.0;
      if (fVar43 <= 1.0) {
        fVar42 = fVar43;
      }
      fVar42 = (float)(~-(uint)(fVar43 < 0.0) & (uint)fVar42);
      uVar27 = -(uint)(fVar42 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar27 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar27 & (uint)fVar42);
      fVar42 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar43 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar23 = (uint)(0.0 < fVar42) - (uint)(0.0 < fVar43);
      if (iVar23 != 0) {
        NavUpdateWindowingHighlightWindow(iVar23);
        pIVar19->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001542a5;
      pbVar6 = &pIVar19->NavWindowingToggleLayer;
      *pbVar6 = (bool)(*pbVar6 &
                      (pIVar19->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar19->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar6 == false) {
        pIVar25 = pIVar19->NavWindowingTarget;
        bVar37 = false;
      }
      else {
        bVar37 = pIVar19->NavWindow != (ImGuiWindow *)0x0;
        pIVar25 = (ImGuiWindow *)0x0;
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar19->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar43 = (pIVar19->NavWindowingTimer + -0.2) / 0.05;
      fVar42 = 1.0;
      if (fVar43 <= 1.0) {
        fVar42 = fVar43;
      }
      fVar42 = (float)(~-(uint)(fVar43 < 0.0) & (uint)fVar42);
      uVar27 = -(uint)(fVar42 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar27 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar27 & (uint)fVar42);
      iVar23 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar23) && (bVar39 = IsKeyPressed(iVar23,true), bVar39)) {
        NavUpdateWindowingHighlightWindow((pIVar19->IO).KeyShift - 1 | 1);
      }
      if ((pIVar19->IO).KeyCtrl == false) {
        pIVar25 = pIVar19->NavWindowingTarget;
      }
    }
    pIVar20 = GImGui;
    fVar42 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar42 == 0.0) && (!NAN(fVar42))) {
      pIVar19->NavWindowingToggleLayer = true;
    }
    bVar39 = bVar37;
    if ((((pIVar19->ActiveId == 0) || (pIVar19->ActiveIdAllowOverlap == true)) && (fVar42 < 0.0)) &&
       ((pIVar19->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar20->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar38 = IsMousePosValid(&(pIVar19->IO).MousePos);
      bVar21 = IsMousePosValid(&(pIVar19->IO).MousePosPrev);
      bVar39 = true;
      if (bVar21 != bVar38) {
        bVar39 = bVar37;
      }
    }
    pIVar29 = pIVar19->NavWindowingTarget;
    if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 4) == 0)) {
      IVar11 = pIVar19->NavInputSource;
      IVar45.x = 0.0;
      IVar45.y = 0.0;
      if ((IVar11 == ImGuiInputSource_NavKeyboard) && ((pIVar19->IO).KeyShift == false)) {
        IVar45 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar11 == ImGuiInputSource_NavGamepad) {
        IVar45 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar42 = IVar45.y;
      if (((IVar45.x != 0.0) || (fVar42 != 0.0)) || (NAN(fVar42))) {
        fVar43 = (pIVar19->IO).DisplayFramebufferScale.x;
        fVar52 = (pIVar19->IO).DisplayFramebufferScale.y;
        if (fVar52 <= fVar43) {
          fVar43 = fVar52;
        }
        fVar43 = (float)(int)(fVar43 * (pIVar19->IO).DeltaTime * 800.0);
        pIVar29 = pIVar29->RootWindow;
        local_40.Min.x = IVar45.x * fVar43 + (pIVar29->Pos).x;
        local_40.Min.y = fVar42 * fVar43 + (pIVar29->Pos).y;
        SetWindowPos(pIVar29,&local_40.Min,1);
        pIVar19->NavDisableMouseHover = true;
        if (((pIVar19->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar25 != (ImGuiWindow *)0x0) {
      if ((pIVar19->NavWindow == (ImGuiWindow *)0x0) || (pIVar25 != pIVar19->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
        pIVar29 = pIVar25->NavLastChildNavWindow;
        if (pIVar25->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar29 = pIVar25;
        }
        ClosePopupsOverWindow(pIVar29,false);
        FocusWindow(pIVar29);
        if (pIVar29->NavLastIds[0] == 0) {
          NavInitWindow(pIVar29,false);
        }
        if ((pIVar29->DC).NavLayerActiveMask == 2) {
          pIVar19->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar39) && (pIVar25 = pIVar19->NavWindow, pIVar29 = pIVar25, pIVar25 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar29, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar29 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar25) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar25;
      }
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      IVar34 = ImGuiNavLayer_Main;
      if (((pIVar19->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar34 = pIVar19->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar34);
    }
  }
  else {
    pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar41 & 1) == 0 & (bVar30 ^ 1)) == 0) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)) {
    bVar37 = (pIVar18->NavWindow->Flags & 0x40000U) == 0;
    (pIVar18->IO).NavActive = bVar37;
    if (((!bVar37) || (pIVar18->NavId == 0)) ||
       (bVar37 = true, pIVar18->NavDisableHighlight != false)) goto LAB_00154630;
  }
  else {
    (pIVar18->IO).NavActive = false;
LAB_00154630:
    bVar37 = pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar18->IO).NavVisible = bVar37;
  fVar42 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar42 == 0.0) && (!NAN(fVar42))) {
    if (pIVar18->ActiveId == 0) {
      pIVar25 = pIVar18->NavWindow;
      if (((pIVar25 == (ImGuiWindow *)0x0) || ((pIVar25->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar25->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar23 = (pIVar18->OpenPopupStack).Size;
        if ((long)iVar23 < 1) {
          if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x5000000U) != 0x1000000)) {
              pIVar25->NavLastIds[0] = 0;
            }
            pIVar18->NavId = 0;
            pIVar18->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar18->OpenPopupStack).Data[(long)iVar23 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar23 + -1,true);
        }
      }
      else {
        if (pIVar25->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x2134,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar25->ParentWindow);
        pIVar19 = GImGui;
        pIVar29 = GImGui->NavWindow;
        if (pIVar29 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x1ef8,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar10 = pIVar25->ChildId;
        GImGui->NavId = IVar10;
        pIVar19->NavFocusScopeId = 0;
        pIVar29->NavLastIds[0] = IVar10;
        pIVar18->NavIdIsAlive = false;
        if (pIVar18->NavDisableMouseHover == true) {
          pIVar18->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar18->NavActivateId = 0;
  pIVar18->NavActivateDownId = 0;
  pIVar18->NavActivatePressedId = 0;
  pIVar19 = GImGui;
  pIVar18->NavInputId = 0;
  IVar10 = pIVar18->NavId;
  if ((((IVar10 != 0) && (pIVar18->NavDisableHighlight == false)) &&
      (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar18->NavWindow != (ImGuiWindow *)0x0 && ((pIVar18->NavWindow->Flags & 0x40000) == 0)))) {
    fVar42 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar42) {
      bVar37 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar37 = false;
    }
    IVar12 = pIVar18->ActiveId;
    if (bVar37 && IVar12 == 0) {
      pIVar18->NavActivateId = IVar10;
    }
    if (IVar12 == 0) {
      if (0.0 < fVar42) goto LAB_00155e16;
    }
    else if (IVar12 == IVar10 && 0.0 < fVar42) {
LAB_00155e16:
      pIVar18->NavActivateDownId = IVar10;
    }
    if (IVar12 == 0) {
      if (bVar37) goto LAB_00155e2c;
    }
    else if ((bool)(bVar37 & IVar12 == IVar10)) {
LAB_00155e2c:
      pIVar18->NavActivatePressedId = IVar10;
    }
    if (((IVar12 == 0 || IVar12 == IVar10) &&
        (fVar42 = (pIVar19->IO).NavInputsDownDuration[2], fVar42 == 0.0)) && (!NAN(fVar42))) {
      pIVar18->NavInputId = IVar10;
    }
  }
  pIVar25 = pIVar18->NavWindow;
  if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) != 0)) {
    pIVar18->NavDisableHighlight = true;
  }
  IVar10 = pIVar18->NavActivateId;
  if ((IVar10 != 0) && (pIVar18->NavActivateDownId != IVar10)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x2162,"void ImGui::NavUpdate()");
  }
  pIVar18->NavMoveRequest = false;
  IVar10 = pIVar18->NavNextActivateId;
  if (IVar10 != 0) {
    pIVar18->NavInputId = IVar10;
    pIVar18->NavActivatePressedId = IVar10;
    pIVar18->NavActivateDownId = IVar10;
    pIVar18->NavActivateId = IVar10;
  }
  pIVar18->NavNextActivateId = 0;
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar18->NavMoveDir = -1;
    pIVar18->NavMoveRequestFlags = 0;
    if (((pIVar25 != (ImGuiWindow *)0x0) && (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar25->Flags & 0x40000) == 0)) {
      uVar27 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar27 & 1) == 0) &&
         ((fVar42 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar42 ||
          (fVar42 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar42)))) {
        pIVar18->NavMoveDir = 0;
      }
      if (((uVar27 & 2) == 0) &&
         ((fVar42 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar42 ||
          (fVar42 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar42)))) {
        pIVar18->NavMoveDir = 1;
      }
      if (((uVar27 & 4) == 0) &&
         ((fVar42 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar42 ||
          (fVar42 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar42)))) {
        pIVar18->NavMoveDir = 2;
      }
      if (((uVar27 & 8) == 0) &&
         ((fVar42 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar42 ||
          (fVar42 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar42)))) {
        pIVar18->NavMoveDir = 3;
      }
    }
    pIVar18->NavMoveClipDir = pIVar18->NavMoveDir;
  }
  else {
    if ((pIVar18->NavMoveDir == -1) || (pIVar18->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x217d,"void ImGui::NavUpdate()");
    }
    if (pIVar18->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x217e,"void ImGui::NavUpdate()");
    }
    pIVar18->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar19 = GImGui;
  fVar42 = 0.0;
  if (((((uVar41 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar25 = GImGui->NavWindow, pIVar25 != (ImGuiWindow *)0x0)) &&
     ((((pIVar25->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar37 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar39 = false;
    bVar38 = false;
    if (bVar37) {
      bVar38 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar37 = IsKeyDown((pIVar19->IO).KeyMap[6]);
    if (bVar37) {
      bVar39 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar37 = IsKeyPressed((pIVar19->IO).KeyMap[7],true);
    if (bVar37) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar37 = false;
    }
    bVar21 = IsKeyPressed((pIVar19->IO).KeyMap[8],true);
    if (bVar21) {
      bVar21 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar21 = false;
    }
    fVar42 = 0.0;
    if ((bVar38 != bVar39) || (bVar37 != bVar21)) {
      if (((pIVar25->DC).NavLayerActiveMask == 0) && ((pIVar25->DC).NavHasScroll == true)) {
        bVar39 = IsKeyPressed((pIVar19->IO).KeyMap[5],true);
        if (bVar39) {
          (pIVar25->ScrollTarget).y =
               (pIVar25->Scroll).y - ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y);
LAB_001560e2:
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar39 = IsKeyPressed((pIVar19->IO).KeyMap[6],true);
          if (bVar39) {
            fVar42 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) + (pIVar25->Scroll).y
            ;
LAB_001560db:
            (pIVar25->ScrollTarget).y = fVar42;
            goto LAB_001560e2;
          }
          if (bVar37 == false) {
            if (bVar21 != false) {
              fVar42 = (pIVar25->ScrollMax).y;
              goto LAB_001560db;
            }
          }
          else {
            (pIVar25->ScrollTarget).y = 0.0;
            (pIVar25->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_001560eb:
        fVar42 = 0.0;
      }
      else {
        IVar34 = pIVar19->NavLayer;
        pIVar32 = pIVar25->NavRectRel + IVar34;
        fVar42 = GImGui->FontBaseSize * pIVar25->FontWindowScale;
        if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
          fVar42 = fVar42 * pIVar25->ParentWindow->FontWindowScale;
        }
        fVar42 = (pIVar25->NavRectRel[IVar34].Max.y - pIVar25->NavRectRel[IVar34].Min.y) +
                 (((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) - fVar42);
        fVar42 = (float)(~-(uint)(fVar42 <= 0.0) & (uint)fVar42);
        bVar39 = IsKeyPressed((pIVar19->IO).KeyMap[5],true);
        if (bVar39) {
          fVar42 = -fVar42;
          pIVar19->NavMoveDir = 3;
          pIVar19->NavMoveClipDir = 2;
          pIVar19->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar39 = IsKeyPressed((pIVar19->IO).KeyMap[6],true);
          if (bVar39) {
            pIVar19->NavMoveDir = 2;
            pIVar19->NavMoveClipDir = 3;
            pIVar19->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar37 != false) {
              fVar42 = -(pIVar25->Scroll).y;
              pIVar25->NavRectRel[IVar34].Max.y = fVar42;
              pIVar25->NavRectRel[IVar34].Min.y = fVar42;
              fVar42 = (pIVar32->Min).x;
              pIVar8 = &pIVar25->NavRectRel[IVar34].Max;
              if (pIVar8->x <= fVar42 && fVar42 != pIVar8->x) {
                pIVar25->NavRectRel[IVar34].Max.x = 0.0;
                (pIVar32->Min).x = 0.0;
              }
              pIVar19->NavMoveDir = 3;
              pIVar19->NavMoveRequestFlags = 0x50;
              goto LAB_001560eb;
            }
            fVar42 = 0.0;
            if (bVar21 != false) {
              fVar43 = ((pIVar25->ScrollMax).y + (pIVar25->SizeFull).y) - (pIVar25->Scroll).y;
              pIVar25->NavRectRel[IVar34].Max.y = fVar43;
              pIVar25->NavRectRel[IVar34].Min.y = fVar43;
              fVar43 = (pIVar32->Min).x;
              pIVar8 = &pIVar25->NavRectRel[IVar34].Max;
              if (pIVar8->x <= fVar43 && fVar43 != pIVar8->x) {
                pIVar25->NavRectRel[IVar34].Max.x = 0.0;
                (pIVar32->Min).x = 0.0;
              }
              pIVar19->NavMoveDir = 2;
              pIVar19->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar41 = pIVar18->NavMoveDir;
  if (uVar41 != 0xffffffff) {
    pIVar18->NavMoveRequest = true;
    pIVar18->NavMoveRequestKeyMods = (pIVar18->IO).KeyMods;
    pIVar18->NavMoveDirLast = uVar41;
  }
  bVar37 = pIVar18->NavMoveRequest;
  if ((bVar37 == true) && (pIVar18->NavId == 0)) {
    pIVar18->NavInitRequest = true;
    pIVar18->NavInitRequestFromMove = true;
    pIVar18->NavInitResultId = 0;
    pIVar18->NavDisableHighlight = false;
  }
  pIVar19 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar6 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar6;
    if (*pbVar6 != false) goto LAB_00154ab8;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00154ab8:
    if (pIVar19->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x206c,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar25 = pIVar18->NavWindow;
  if (((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) == 0)) &&
     (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar43 = pIVar19->FontBaseSize * pIVar25->FontWindowScale;
    if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
      fVar43 = fVar43 * pIVar25->ParentWindow->FontWindowScale;
    }
    fVar43 = (float)(int)(fVar43 * 100.0 * (pIVar18->IO).DeltaTime + 0.5);
    if (((pIVar25->DC).NavLayerActiveMask == 0) && (((pIVar25->DC).NavHasScroll & bVar37) == 1)) {
      if (uVar41 < 2) {
        (pIVar25->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0018a598 + (ulong)(uVar41 == 0) * 4) * fVar43 +
                         (pIVar25->Scroll).x);
        (pIVar25->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar41 & 0xfffffffe) == 2) {
        (pIVar25->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0018a598 + (ulong)(uVar41 == 2) * 4) * fVar43 +
                         (pIVar25->Scroll).y);
        (pIVar25->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar45 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar52 = IVar45.x;
    fVar44 = IVar45.y;
    if (((fVar52 != 0.0) || (NAN(fVar52))) && (pIVar25->ScrollbarX == true)) {
      (pIVar25->ScrollTarget).x = (float)(int)(fVar52 * fVar43 + (pIVar25->Scroll).x);
      (pIVar25->ScrollTargetCenterRatio).x = 0.0;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
    if ((fVar44 != 0.0) || (NAN(fVar44))) {
      (pIVar25->ScrollTarget).y = (float)(int)(fVar44 * fVar43 + (pIVar25->Scroll).y);
      (pIVar25->ScrollTargetCenterRatio).y = 0.0;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar18->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocal).ID = 0;
  (pIVar18->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar18->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar18->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultOther).ID = 0;
  (pIVar18->NavMoveResultOther).FocusScopeId = 0;
  (pIVar18->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar37 != false) && (pIVar18->NavMoveFromClampedRefRect == true)) &&
     (pIVar18->NavLayer == ImGuiNavLayer_Main)) {
    fVar43 = (pIVar25->Pos).x;
    fVar52 = (pIVar25->Pos).y;
    fVar55 = ((pIVar25->InnerRect).Min.x - fVar43) + -1.0;
    fVar54 = ((pIVar25->InnerRect).Min.y - fVar52) + -1.0;
    fVar44 = ((pIVar25->InnerRect).Max.x - fVar43) + 1.0;
    fVar52 = ((pIVar25->InnerRect).Max.y - fVar52) + 1.0;
    fVar43 = pIVar25->NavRectRel[0].Min.x;
    if (((fVar43 < fVar55) || (pIVar25->NavRectRel[0].Min.y < fVar54)) ||
       ((fVar44 < pIVar25->NavRectRel[0].Max.x || (fVar52 < pIVar25->NavRectRel[0].Max.y)))) {
      fVar57 = pIVar19->FontBaseSize * pIVar25->FontWindowScale;
      if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
        fVar57 = fVar57 * pIVar25->ParentWindow->FontWindowScale;
      }
      fVar57 = fVar57 * 0.5;
      fVar58 = fVar44 - fVar55;
      if (fVar57 <= fVar44 - fVar55) {
        fVar58 = fVar57;
      }
      fVar59 = fVar52 - fVar54;
      if (fVar57 <= fVar52 - fVar54) {
        fVar59 = fVar57;
      }
      uVar41 = -(uint)(fVar55 + fVar58 <= fVar43);
      fVar57 = pIVar25->NavRectRel[0].Min.y;
      fVar9 = pIVar25->NavRectRel[0].Max.x;
      uVar27 = -(uint)(fVar54 + fVar59 <= fVar57);
      pIVar25->NavRectRel[0].Min.x =
           (float)(uVar41 & (uint)fVar43 | ~uVar41 & (uint)(fVar55 + fVar58));
      pIVar25->NavRectRel[0].Min.y =
           (float)(uVar27 & (uint)fVar57 | ~uVar27 & (uint)(fVar54 + fVar59));
      if (fVar44 - fVar58 <= fVar9) {
        fVar9 = fVar44 - fVar58;
      }
      fVar43 = pIVar25->NavRectRel[0].Max.y;
      if (fVar52 - fVar59 <= fVar43) {
        fVar43 = fVar52 - fVar59;
      }
      IVar56.y = fVar43;
      IVar56.x = fVar9;
      pIVar25->NavRectRel[0].Max = IVar56;
      pIVar18->NavId = 0;
      pIVar18->NavFocusScopeId = 0;
    }
    pIVar18->NavMoveFromClampedRefRect = false;
  }
  pIVar25 = pIVar18->NavWindow;
  if (pIVar25 == (ImGuiWindow *)0x0) {
LAB_00154e93:
    fVar54 = 0.0;
    fVar52 = 0.0;
    fVar44 = 0.0;
    fVar43 = 0.0;
  }
  else {
    IVar34 = pIVar18->NavLayer;
    fVar43 = pIVar25->NavRectRel[IVar34].Min.x;
    fVar52 = pIVar25->NavRectRel[IVar34].Max.x;
    if (fVar52 < fVar43) goto LAB_00154e93;
    fVar44 = pIVar25->NavRectRel[IVar34].Min.y;
    fVar54 = pIVar25->NavRectRel[IVar34].Max.y;
    if (fVar54 < fVar44) goto LAB_00154e93;
  }
  if (pIVar25 == (ImGuiWindow *)0x0) {
    fVar52 = (GImGui->IO).DisplaySize.x;
    fVar54 = (GImGui->IO).DisplaySize.y;
    IVar53.x = 0.0;
    IVar53.y = 0.0;
  }
  else {
    fVar55 = (pIVar25->Pos).x;
    fVar57 = (pIVar25->Pos).y;
    IVar53.x = fVar43 + fVar55;
    IVar53.y = fVar44 + fVar57;
    fVar52 = fVar52 + fVar55;
    fVar54 = fVar54 + fVar57;
  }
  IVar46.y = fVar54;
  IVar46.x = fVar52;
  (pIVar18->NavScoringRect).Min = IVar53;
  (pIVar18->NavScoringRect).Max = IVar46;
  fVar44 = (pIVar18->NavScoringRect).Min.y + fVar42;
  (pIVar18->NavScoringRect).Min.y = fVar44;
  fVar42 = fVar42 + (pIVar18->NavScoringRect).Max.y;
  (pIVar18->NavScoringRect).Max.y = fVar42;
  fVar52 = (pIVar18->NavScoringRect).Min.x + 1.0;
  fVar43 = (pIVar18->NavScoringRect).Max.x;
  if (fVar43 <= fVar52) {
    fVar52 = fVar43;
  }
  (pIVar18->NavScoringRect).Min.x = fVar52;
  (pIVar18->NavScoringRect).Max.x = fVar52;
  if (fVar42 < fVar44) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x21d0,"void ImGui::NavUpdate()");
  }
  pIVar18->NavScoringCount = 0;
  pIVar18 = GImGui;
  pIVar8 = &(GImGui->IO).MousePos;
  bVar37 = IsMousePosValid(pIVar8);
  if (bVar37) {
    IVar47.x = (float)(int)(pIVar18->IO).MousePos.x;
    IVar47.y = (float)(int)(pIVar18->IO).MousePos.y;
    pIVar18->LastValidMousePos = IVar47;
    (pIVar18->IO).MousePos = IVar47;
  }
  bVar37 = IsMousePosValid(pIVar8);
  if ((bVar37) && (bVar37 = IsMousePosValid(&(pIVar18->IO).MousePosPrev), bVar37)) {
    IVar48.x = (pIVar18->IO).MousePos.x - (pIVar18->IO).MousePosPrev.x;
    IVar48.y = (pIVar18->IO).MousePos.y - (pIVar18->IO).MousePosPrev.y;
    (pIVar18->IO).MouseDelta = IVar48;
  }
  else {
    (pIVar18->IO).MouseDelta.x = 0.0;
    (pIVar18->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar18->IO).MouseDelta.x != 0.0) || (fVar42 = (pIVar18->IO).MouseDelta.y, fVar42 != 0.0))
     || (NAN(fVar42))) {
    pIVar18->NavDisableMouseHover = false;
  }
  (pIVar18->IO).MousePosPrev = (pIVar18->IO).MousePos;
  lVar24 = -5;
  do {
    fVar42 = -1.0;
    bVar37 = (pIVar18->IO).MouseDown[lVar24 + 5];
    if (bVar37 == true) {
      pfVar4 = (pIVar18->IO).MouseDownDurationPrev + lVar24;
      bVar39 = *pfVar4 <= 0.0 && *pfVar4 != 0.0;
    }
    else {
      bVar39 = false;
    }
    (pIVar18->IO).MouseDoubleClicked[lVar24] = bVar39;
    if (bVar37 == false) {
      bVar38 = 0.0 <= (pIVar18->IO).MouseDownDurationPrev[lVar24];
    }
    else {
      bVar38 = false;
    }
    (pIVar18->IO).MouseDownOwned[lVar24] = bVar38;
    fVar43 = (pIVar18->IO).MouseDownDurationPrev[lVar24];
    (&(pIVar18->IO).MouseDragMaxDistanceAbs[0].x)[lVar24] = fVar43;
    if ((bVar37 != false) && (fVar42 = 0.0, 0.0 <= fVar43)) {
      fVar42 = fVar43 + (pIVar18->IO).DeltaTime;
    }
    (pIVar18->IO).MouseDownDurationPrev[lVar24] = fVar42;
    (pIVar18->IO).MouseReleased[lVar24] = false;
    if (bVar39 == false) {
      if (bVar37 != false) {
        bVar37 = IsMousePosValid(pIVar8);
        fVar42 = 0.0;
        fVar43 = 0.0;
        if (bVar37) {
          fVar42 = (pIVar18->IO).MousePos.x -
                   *(float *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4);
          fVar43 = (pIVar18->IO).MousePos.y - *(float *)((pIVar18->IO).MouseClickedTime + lVar24);
        }
        fVar52 = (pIVar18->IO).KeysDownDuration[lVar24];
        fVar44 = -fVar43;
        if (-fVar43 <= fVar43) {
          fVar44 = fVar43;
        }
        fVar43 = fVar42 * fVar42 + fVar43 * fVar43;
        uVar41 = -(uint)(fVar43 <= fVar52);
        (pIVar18->IO).KeysDownDuration[lVar24] =
             (float)(~uVar41 & (uint)fVar43 | (uint)fVar52 & uVar41);
        fVar43 = -fVar42;
        if (-fVar42 <= fVar42) {
          fVar43 = fVar42;
        }
        fVar42 = (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2];
        fVar52 = (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2 + 1];
        uVar41 = -(uint)(fVar43 <= fVar42);
        (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2] =
             (float)(~uVar41 & (uint)fVar43 | (uint)fVar42 & uVar41);
        uVar41 = -(uint)(fVar44 <= fVar52);
        (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2 + 1] =
             (float)(~uVar41 & (uint)fVar44 | (uint)fVar52 & uVar41);
      }
    }
    else {
      dVar49 = pIVar18->Time;
      if ((float)(dVar49 - *(double *)((pIVar18->IO).MouseClicked + lVar24 * 8)) <
          (pIVar18->IO).MouseDoubleClickTime) {
        bVar37 = IsMousePosValid(pIVar8);
        fVar42 = 0.0;
        fVar43 = 0.0;
        if (bVar37) {
          fVar42 = (pIVar18->IO).MousePos.x -
                   *(float *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4);
          fVar43 = (pIVar18->IO).MousePos.y - *(float *)((pIVar18->IO).MouseClickedTime + lVar24);
        }
        fVar52 = (pIVar18->IO).MouseDoubleClickMaxDist;
        dVar49 = -1.79769313486232e+308;
        if (fVar42 * fVar42 + fVar43 * fVar43 < fVar52 * fVar52) {
          (pIVar18->IO).MouseReleased[lVar24] = true;
          dVar49 = -1.79769313486232e+308;
        }
      }
      *(double *)((pIVar18->IO).MouseClicked + lVar24 * 8) = dVar49;
      *(ImVec2 *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4) = (pIVar18->IO).MousePos;
      *(bool *)((long)(pIVar18->IO).MouseDownDuration + lVar24 + -3) =
           (pIVar18->IO).MouseReleased[lVar24];
      pfVar4 = (pIVar18->IO).MouseDragMaxDistanceSqr + lVar24 * 2;
      pfVar4[0] = 0.0;
      pfVar4[1] = 0.0;
      (pIVar18->IO).KeysDownDuration[lVar24] = 0.0;
    }
    if (((pIVar18->IO).MouseDown[lVar24 + 5] == false) &&
       ((pIVar18->IO).MouseDownOwned[lVar24] == false)) {
      *(undefined1 *)((long)(pIVar18->IO).MouseDownDuration + lVar24 + -3) = 0;
    }
    if ((pIVar18->IO).MouseDoubleClicked[lVar24] == true) {
      pIVar18->NavDisableMouseHover = false;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar25 = GetTopMostPopupModal();
  if ((pIVar25 != (ImGuiWindow *)0x0) ||
     ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar17->NavWindowingHighlightAlpha)))) {
    fVar42 = (pIVar17->IO).DeltaTime * 6.0 + pIVar17->DimBgRatio;
    if (1.0 <= fVar42) {
      fVar42 = 1.0;
    }
    pIVar17->DimBgRatio = fVar42;
  }
  else {
    fVar42 = (pIVar17->IO).DeltaTime * -10.0 + pIVar17->DimBgRatio;
    pIVar17->DimBgRatio = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  }
  pIVar17->MouseCursor = 0;
  pIVar17->WantTextInputNextFrame = -1;
  pIVar17->WantCaptureMouseNextFrame = -1;
  pIVar17->WantCaptureKeyboardNextFrame = -1;
  (pIVar17->PlatformImePos).x = 1.0;
  pIVar18 = GImGui;
  (pIVar17->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar37 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar37) &&
       (fVar42 = (pIVar18->IO).MouseDragThreshold,
       fVar43 = (pIVar18->IO).MousePos.x - (pIVar18->WheelingWindowRefMousePos).x,
       fVar52 = (pIVar18->IO).MousePos.y - (pIVar18->WheelingWindowRefMousePos).y,
       fVar42 * fVar42 < fVar43 * fVar43 + fVar52 * fVar52)) {
      pIVar18->WheelingWindowTimer = 0.0;
    }
    if (pIVar18->WheelingWindowTimer <= 0.0) {
      pIVar18->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar18->WheelingWindowTimer = 0.0;
    }
  }
  pIVar19 = GImGui;
  fVar42 = (pIVar18->IO).MouseWheel;
  if (((fVar42 != 0.0) || (fVar43 = (pIVar18->IO).MouseWheelH, fVar43 != 0.0)) || (NAN(fVar43))) {
    pIVar25 = pIVar18->WheelingWindow;
    if (pIVar25 == (ImGuiWindow *)0x0) {
      pIVar25 = pIVar18->HoveredWindow;
    }
    if ((pIVar25 != (ImGuiWindow *)0x0) && (pIVar25->Collapsed == false)) {
      fVar43 = 0.0;
      if ((fVar42 != 0.0) || (NAN(fVar42))) {
        if (((pIVar18->IO).KeyCtrl == true) && ((pIVar18->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar25) {
            GImGui->WheelingWindow = pIVar25;
            pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
            pIVar19->WheelingWindowTimer = 2.0;
          }
          fVar42 = pIVar25->FontWindowScale;
          fVar52 = (pIVar18->IO).MouseWheel * 0.1 + fVar42;
          fVar43 = 2.5;
          if (fVar52 <= 2.5) {
            fVar43 = fVar52;
          }
          fVar43 = (float)(-(uint)(fVar52 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar52 < 0.5) & (uint)fVar43);
          pIVar25->FontWindowScale = fVar43;
          if ((pIVar25->Flags & 0x1000000) == 0) {
            fVar43 = fVar43 / fVar42;
            fVar42 = (pIVar25->Size).x;
            fVar52 = (pIVar25->Size).y;
            fVar44 = (pIVar25->Pos).x;
            fVar54 = (pIVar25->Pos).y;
            local_40.Min.y =
                 (((pIVar18->IO).MousePos.y - fVar54) * (1.0 - fVar43) * fVar52) / fVar52 + fVar54;
            local_40.Min.x =
                 (((pIVar18->IO).MousePos.x - fVar44) * (1.0 - fVar43) * fVar42) / fVar42 + fVar44;
            SetWindowPos(pIVar25,&local_40.Min,0);
            IVar50.x = (float)(int)((pIVar25->Size).x * fVar43);
            IVar50.y = (float)(int)((pIVar25->Size).y * fVar43);
            pIVar25->Size = IVar50;
            IVar51.x = (float)(int)((pIVar25->SizeFull).x * fVar43);
            IVar51.y = (float)(int)(fVar43 * (pIVar25->SizeFull).y);
            pIVar25->SizeFull = IVar51;
          }
          goto LAB_00155907;
        }
        if ((pIVar18->IO).KeyShift == false) {
          fVar43 = fVar42;
        }
      }
      if (((fVar43 != 0.0) || (NAN(fVar43))) && ((pIVar18->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar25) {
          GImGui->WheelingWindow = pIVar25;
          pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
          pIVar19->WheelingWindowTimer = 2.0;
        }
        uVar41 = pIVar25->Flags;
        while (((uVar41 >> 0x18 & 1) != 0 &&
               (((uVar41 & 0x210) == 0x10 ||
                ((fVar42 = (pIVar25->ScrollMax).y, fVar42 == 0.0 && (!NAN(fVar42)))))))) {
          pIVar25 = pIVar25->ParentWindow;
          uVar41 = pIVar25->Flags;
        }
        if ((uVar41 & 0x210) == 0) {
          fVar42 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) * 0.67;
          fVar52 = pIVar19->FontBaseSize * pIVar25->FontWindowScale;
          if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
            fVar52 = fVar52 * pIVar25->ParentWindow->FontWindowScale;
          }
          fVar44 = fVar52 * 5.0;
          if (fVar42 <= fVar52 * 5.0) {
            fVar44 = fVar42;
          }
          (pIVar25->ScrollTarget).y = (pIVar25->Scroll).y - fVar43 * (float)(int)fVar44;
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      pIVar19 = GImGui;
      fVar42 = (pIVar18->IO).MouseWheelH;
      if (((fVar42 == 0.0) && (!NAN(fVar42))) || ((pIVar18->IO).KeyShift == true)) {
        fVar43 = (pIVar18->IO).MouseWheel;
        if ((fVar43 != 0.0) || (NAN(fVar43))) {
          fVar42 = 0.0;
          if ((pIVar18->IO).KeyShift == true) {
            fVar42 = fVar43;
          }
        }
        else {
          fVar42 = 0.0;
        }
      }
      if (((fVar42 != 0.0) || (NAN(fVar42))) && ((pIVar18->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar25) {
          GImGui->WheelingWindow = pIVar25;
          pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
          pIVar19->WheelingWindowTimer = 2.0;
        }
        while ((uVar41 = pIVar25->Flags, (uVar41 >> 0x18 & 1) != 0 &&
               (((uVar41 & 0x210) == 0x10 ||
                ((fVar43 = (pIVar25->ScrollMax).x, fVar43 == 0.0 && (!NAN(fVar43)))))))) {
          pIVar25 = pIVar25->ParentWindow;
        }
        if ((uVar41 & 0x210) == 0) {
          fVar43 = ((pIVar25->InnerRect).Max.x - (pIVar25->InnerRect).Min.x) * 0.67;
          fVar52 = pIVar19->FontBaseSize * pIVar25->FontWindowScale;
          if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
            fVar52 = fVar52 * pIVar25->ParentWindow->FontWindowScale;
          }
          fVar44 = fVar52 + fVar52;
          if (fVar43 <= fVar52 + fVar52) {
            fVar44 = fVar43;
          }
          (pIVar25->ScrollTarget).x = (pIVar25->Scroll).x - fVar42 * (float)(int)fVar44;
          (pIVar25->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_00155907:
  pIVar18 = GImGui;
  pIVar25 = GImGui->NavWindow;
  if (((pIVar25 == (ImGuiWindow *)0x0) || (pIVar25->Active != true)) ||
     (((pIVar25->Flags & 0x40000) != 0 ||
      (((GImGui->IO).KeyCtrl != false || (iVar23 = (GImGui->IO).KeyMap[0], iVar23 < 0)))))) {
    bVar37 = false;
  }
  else {
    bVar37 = IsKeyPressed(iVar23,true);
  }
  pIVar18->FocusTabPressed = bVar37;
  if ((bVar37 != false) && (pIVar18->ActiveId == 0)) {
    pIVar18->FocusRequestNextWindow = pIVar18->NavWindow;
    pIVar18->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar18->NavId == 0) || (pIVar18->NavIdTabCounter == 0x7fffffff)) {
      iVar23 = -(uint)(pIVar18->IO).KeyShift;
    }
    else {
      iVar23 = pIVar18->NavIdTabCounter + (-(uint)(pIVar18->IO).KeyShift | 1) + 1;
    }
    pIVar18->FocusRequestNextCounterTabStop = iVar23;
  }
  pIVar18->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar18->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar18->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar25 = pIVar18->FocusRequestNextWindow;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    pIVar18->FocusRequestCurrWindow = pIVar25;
    if ((pIVar18->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar23 = (pIVar25->DC).FocusCounterRegular, iVar23 != -1)) {
      pIVar18->FocusRequestCurrCounterRegular =
           (pIVar18->FocusRequestNextCounterRegular + iVar23 + 1) % (iVar23 + 1);
    }
    if ((pIVar18->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar23 = (pIVar25->DC).FocusCounterTabStop, iVar23 != -1)) {
      pIVar18->FocusRequestCurrCounterTabStop =
           (pIVar18->FocusRequestNextCounterTabStop + iVar23 + 1) % (iVar23 + 1);
    }
    pIVar18->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar18->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar18->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar18->NavIdTabCounter = 0x7fffffff;
  if ((pIVar17->WindowsFocusOrder).Size != (pIVar17->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xefc,"void ImGui::NewFrame()");
  }
  fVar42 = (pIVar17->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar42) {
    fVar42 = (float)pIVar17->Time - fVar42;
  }
  else {
    fVar42 = 3.4028235e+38;
  }
  uVar41 = (pIVar17->Windows).Size;
  uVar26 = (ulong)uVar41;
  if (uVar41 != 0) {
    uVar36 = 0;
    do {
      if ((long)(int)uVar26 <= (long)uVar36) {
        pcVar28 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0015614a;
      }
      pIVar25 = (pIVar17->Windows).Data[uVar36];
      bVar37 = pIVar25->Active;
      pIVar25->WasActive = bVar37;
      pIVar25->BeginCount = 0;
      pIVar25->Active = false;
      pIVar25->WriteAccessed = false;
      if (((bVar37 == false) && (pIVar25->MemoryCompacted == false)) &&
         (pIVar25->LastTimeActive <= fVar42 && fVar42 != pIVar25->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar25);
      }
      uVar36 = uVar36 + 1;
      uVar26 = (ulong)(uint)(pIVar17->Windows).Size;
    } while (uVar36 != uVar26);
  }
  if ((pIVar17->NavWindow != (ImGuiWindow *)0x0) && (pIVar17->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar23 = (pIVar17->CurrentWindowStack).Capacity;
  if (iVar23 < 0) {
    uVar41 = iVar23 / 2 + iVar23;
    uVar26 = 0;
    if (0 < (int)uVar41) {
      uVar26 = (ulong)uVar41;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar26 * 8,GImAllocatorUserData);
    ppIVar15 = (pIVar17->CurrentWindowStack).Data;
    if (ppIVar15 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar15,(long)(pIVar17->CurrentWindowStack).Size << 3);
      ppIVar15 = (pIVar17->CurrentWindowStack).Data;
      if ((ppIVar15 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar15,GImAllocatorUserData);
    }
    (pIVar17->CurrentWindowStack).Data = __dest_00;
    (pIVar17->CurrentWindowStack).Capacity = (int)uVar26;
  }
  (pIVar17->CurrentWindowStack).Size = 0;
  iVar23 = (pIVar17->BeginPopupStack).Capacity;
  if (iVar23 < 0) {
    uVar41 = iVar23 / 2 + iVar23;
    uVar26 = 0;
    if (0 < (int)uVar41) {
      uVar26 = (ulong)uVar41;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar26 * 0x30,GImAllocatorUserData);
    pIVar16 = (pIVar17->BeginPopupStack).Data;
    if (pIVar16 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar16,(long)(pIVar17->BeginPopupStack).Size * 0x30);
      pIVar16 = (pIVar17->BeginPopupStack).Data;
      if ((pIVar16 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar17->BeginPopupStack).Data = __dest_01;
    (pIVar17->BeginPopupStack).Capacity = (int)uVar26;
  }
  (pIVar17->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar17->NavWindow,false);
  pIVar18 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar18->DebugItemPickerActive == true) {
    uVar41 = pIVar18->HoveredIdPreviousFrame;
    pIVar18->MouseCursor = 7;
    iVar23 = (pIVar18->IO).KeyMap[0xe];
    if ((-1 < iVar23) && (bVar37 = IsKeyPressed(iVar23,true), bVar37)) {
      pIVar18->DebugItemPickerActive = false;
    }
    pIVar19 = GImGui;
    if (uVar41 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar18->DebugItemPickerBreakId = uVar41;
      pIVar18->DebugItemPickerActive = false;
    }
    pIVar7 = &pIVar19->NextWindowData;
    *(byte *)&pIVar7->Flags = (byte)pIVar7->Flags | 0x40;
    (pIVar19->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar41);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar41 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar17->WithinFrameScopeWithImplicitWindow = true;
  pIVar18 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar18->NextWindowData).SizeVal.x = 400.0;
  (pIVar18->NextWindowData).SizeVal.y = 400.0;
  (pIVar18->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar17->CurrentWindow->IsFallbackWindow == false) {
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xf1e,"void ImGui::NewFrame()");
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}